

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp.c
# Opt level: O1

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,float amp,
                        float ampoffset)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (0 < m) {
    uVar4 = 0;
    do {
      dVar9 = cos((double)lsp[uVar4]);
      lsp[uVar4] = (float)(dVar9 + dVar9);
      uVar4 = uVar4 + 1;
    } while ((uint)m != uVar4);
  }
  if (0 < n) {
    iVar3 = 0;
    do {
      lVar7 = (long)iVar3;
      iVar1 = map[lVar7];
      dVar9 = cos((double)((float)iVar1 * (3.1415927 / (float)ln)));
      fVar11 = (float)(dVar9 + dVar9);
      uVar4 = 1;
      fVar8 = 0.5;
      fVar10 = fVar8;
      if (1 < m) {
        uVar4 = 1;
        fVar8 = 0.5;
        fVar10 = fVar8;
        do {
          fVar8 = fVar8 * (fVar11 - lsp[uVar4 - 1]);
          fVar10 = fVar10 * (fVar11 - lsp[uVar4]);
          uVar4 = uVar4 + 2;
        } while ((long)uVar4 < (long)m);
      }
      if ((int)uVar4 == m) {
        fVar8 = fVar8 * (fVar11 - lsp[(uVar4 & 0xffffffff) - 1]);
        fVar12 = 4.0 - fVar11 * fVar11;
        fVar8 = fVar8 * fVar8;
      }
      else {
        fVar12 = 2.0 - fVar11;
        fVar8 = fVar8 * (fVar11 + 2.0) * fVar8;
      }
      dVar9 = (double)(fVar12 * fVar10 * fVar10 + fVar8);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = exp(((double)amp / dVar9 - (double)ampoffset) * 0.1151292473077774);
      curve[lVar7] = curve[lVar7] * (float)dVar9;
      iVar3 = iVar3 + 1;
      if (map[lVar7 + 1] == iVar1) {
        lVar7 = lVar7 + 1;
        lVar5 = 0;
        do {
          curve[lVar7 + lVar5] = curve[lVar7 + lVar5] * (float)dVar9;
          lVar6 = lVar5 + 1;
          lVar2 = lVar5 + 1;
          lVar5 = lVar6;
        } while (map[lVar7 + lVar2] == iVar1);
        iVar3 = iVar3 + (int)lVar6;
      }
    } while (iVar3 < n);
  }
  return;
}

Assistant:

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,
                            float amp,float ampoffset){
  int i;
  float wdel=M_PI/ln;
  for(i=0;i<m;i++)lsp[i]=2.f*cos(lsp[i]);

  i=0;
  while(i<n){
    int j,k=map[i];
    float p=.5f;
    float q=.5f;
    float w=2.f*cos(wdel*k);
    for(j=1;j<m;j+=2){
      q *= w-lsp[j-1];
      p *= w-lsp[j];
    }
    if(j==m){
      /* odd order filter; slightly assymetric */
      /* the last coefficient */
      q*=w-lsp[j-1];
      p*=p*(4.f-w*w);
      q*=q;
    }else{
      /* even order filter; still symmetric */
      p*=p*(2.f-w);
      q*=q*(2.f+w);
    }

    q=fromdB(amp/sqrt(p+q)-ampoffset);

    curve[i]*=q;
    while(map[++i]==k)curve[i]*=q;
  }
}